

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

void sysbvm_identityDictionary_add
               (sysbvm_context_t *context,sysbvm_tuple_t dictionary,sysbvm_tuple_t association)

{
  long lVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  size_t sVar4;
  sysbvm_size_t sVar5;
  size_t capacityThreshold;
  size_t newSize;
  size_t capacity;
  sysbvm_array_t *storage;
  sysbvm_dictionary_t *dictionaryObject;
  intptr_t elementIndex;
  sysbvm_tuple_t key;
  sysbvm_tuple_t association_local;
  sysbvm_tuple_t dictionary_local;
  sysbvm_context_t *context_local;
  
  _Var2 = sysbvm_tuple_isNonNullPointer(dictionary);
  if (_Var2) {
    sVar3 = sysbvm_association_getKey(association);
    dictionaryObject = (sysbvm_dictionary_t *)sysbvm_identityDictionary_scanFor(dictionary,sVar3);
    if ((long)dictionaryObject < 0) {
      sysbvm_identityDictionary_increaseCapacity(context,dictionary);
      dictionaryObject = (sysbvm_dictionary_t *)sysbvm_identityDictionary_scanFor(dictionary,sVar3);
      if ((long)dictionaryObject < 0) {
        sysbvm_error("Dictionary out of memory.");
      }
    }
    lVar1 = *(long *)(dictionary + 0x18);
    if (*(long *)(lVar1 + 0x10 + (long)dictionaryObject * 8) == 0) {
      *(sysbvm_tuple_t *)(lVar1 + 0x10 + (long)dictionaryObject * 8) = association;
      sVar4 = sysbvm_tuple_getSizeInSlots(*(sysbvm_tuple_t *)(dictionary + 0x18));
      sVar5 = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(dictionary + 0x10));
      sVar3 = sysbvm_tuple_size_encode(context,sVar5 + 1);
      *(sysbvm_tuple_t *)(dictionary + 0x10) = sVar3;
      if ((sVar4 << 2) / 5 <= sVar5 + 1) {
        sysbvm_identityDictionary_increaseCapacity(context,dictionary);
      }
    }
    else {
      *(sysbvm_tuple_t *)(lVar1 + 0x10 + (long)dictionaryObject * 8) = association;
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_identityDictionary_add(sysbvm_context_t *context, sysbvm_tuple_t dictionary, sysbvm_tuple_t association)
{
    if(!sysbvm_tuple_isNonNullPointer(dictionary))
        return;

    sysbvm_tuple_t key = sysbvm_association_getKey(association);
    intptr_t elementIndex = sysbvm_identityDictionary_scanFor(dictionary, key);
    if(elementIndex < 0)
    {
        sysbvm_identityDictionary_increaseCapacity(context, dictionary);
        elementIndex = sysbvm_identityDictionary_scanFor(dictionary, key);
        if(elementIndex < 0)
           sysbvm_error("Dictionary out of memory.");
    }

    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *storage = (sysbvm_array_t*)dictionaryObject->storage;
    if(storage->elements[elementIndex])
    {
        storage->elements[elementIndex] = association;
    }
    else
    {
        storage->elements[elementIndex] = association;
        size_t capacity = sysbvm_tuple_getSizeInSlots(dictionaryObject->storage);
        size_t newSize = sysbvm_tuple_size_decode(dictionaryObject->size) + 1;
        dictionaryObject->size = sysbvm_tuple_size_encode(context, newSize);
        size_t capacityThreshold = capacity * 4 / 5;

        // Make sure the maximum occupancy rate is not greater than 80%.
        if(newSize >= capacityThreshold)
            sysbvm_identityDictionary_increaseCapacity(context, dictionary);
    }
}